

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.h
# Opt level: O0

cmCommand * __thiscall cmSubdirCommand::Clone(cmSubdirCommand *this)

{
  cmCommand *this_00;
  cmSubdirCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSubdirCommand((cmSubdirCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmSubdirCommand; }